

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O1

Var Js::JavascriptPromise::EntryReactionTaskFunction
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  RecyclableObject *pRVar2;
  JavascriptPromiseReaction *pJVar3;
  void *pvVar4;
  JavascriptPromiseCapability *pJVar5;
  RecyclableObject *this;
  ThreadContext *this_00;
  code *pcVar6;
  bool bVar7;
  bool bVar8;
  undefined4 *puVar9;
  JavascriptPromiseReactionTaskFunction *pJVar10;
  JavascriptPromise *this_01;
  JavascriptMethod p_Var11;
  Var pvVar12;
  int in_stack_00000010;
  undefined1 local_68 [8];
  ArgumentReader args;
  AutoCatchHandlerExists autoCatchHandlerExists;
  CallInfo local_38;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_38 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != local_38._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x4d6,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar7) goto LAB_00d00172;
    *puVar9 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_68 = (undefined1  [8])local_38;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_68,&local_38);
  if (((ulong)local_38 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x4d7,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar7) goto LAB_00d00172;
    *puVar9 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pRVar2 = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           undefinedValue.ptr;
  pJVar10 = VarTo<Js::JavascriptPromiseReactionTaskFunction,Js::RecyclableObject>(function);
  pJVar3 = (pJVar10->reaction).ptr;
  pvVar4 = (pJVar10->argument).ptr;
  pJVar5 = (pJVar3->capabilities).ptr;
  this = (pJVar3->handler).ptr;
  bVar7 = ScriptContext::IsScriptContextInDebugMode(pSVar1);
  bVar8 = true;
  if (bVar7) {
    pvVar12 = (pJVar5->promise).ptr;
    bVar7 = VarIs<Js::JavascriptPromise>(pvVar12);
    if (bVar7) {
      this_01 = VarTo<Js::JavascriptPromise>(pvVar12);
      bVar8 = WillRejectionBeUnhandled(this_01);
      bVar8 = !bVar8;
    }
  }
  JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)&args.super_Arguments.Values,pSVar1,bVar8);
  this_00 = pSVar1->threadContext;
  bVar7 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
  if (pSVar1->threadContext->noJsReentrancy == true) {
    Throw::FatalJsReentrancyError();
  }
  p_Var11 = RecyclableObject::GetEntryPoint(this);
  CheckIsExecutable(this,p_Var11);
  p_Var11 = RecyclableObject::GetEntryPoint(this);
  pvVar12 = (*p_Var11)(this,(CallInfo)this,0x2000002,0,0,0,0,0x2000002,pRVar2,pvVar4);
  this_00->reentrancySafeOrHandled = bVar7;
  JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)&args.super_Arguments.Values);
  if (pvVar12 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x50b,"(handlerResult != nullptr)","handlerResult != nullptr");
    if (!bVar7) {
LAB_00d00172:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar9 = 0;
  }
  pvVar12 = TryCallResolveOrRejectHandler((pJVar5->resolve).ptr,pvVar12,pSVar1);
  return pvVar12;
}

Assistant:

Var JavascriptPromise::EntryReactionTaskFunction(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();
        Var undefinedVar = scriptContext->GetLibrary()->GetUndefined();

        JavascriptPromiseReactionTaskFunction* reactionTaskFunction = VarTo<JavascriptPromiseReactionTaskFunction>(function);
        JavascriptPromiseReaction* reaction = reactionTaskFunction->GetReaction();
        Var argument = reactionTaskFunction->GetArgument();
        JavascriptPromiseCapability* promiseCapability = reaction->GetCapabilities();
        RecyclableObject* handler = reaction->GetHandler();
        Var handlerResult = nullptr;
        JavascriptExceptionObject* exception = nullptr;

        {

            bool isPromiseRejectionHandled = true;
            if (scriptContext->IsScriptContextInDebugMode())
            {
                // only necessary to determine if false if debugger is attached.  This way we'll
                // correctly break on exceptions raised in promises that result in uhandled rejection
                // notifications
                Var promiseVar = promiseCapability->GetPromise();
                if (VarIs<JavascriptPromise>(promiseVar))
                {
                    JavascriptPromise* promise = VarTo<JavascriptPromise>(promiseVar);
                    isPromiseRejectionHandled = !promise->WillRejectionBeUnhandled();
                }
            }

            Js::JavascriptExceptionOperators::AutoCatchHandlerExists autoCatchHandlerExists(scriptContext, isPromiseRejectionHandled);
            try
            {
                BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                {
                    handlerResult = CALL_FUNCTION(scriptContext->GetThreadContext(),
                                        handler, Js::CallInfo(Js::CallFlags::CallFlags_Value, 2),
                                        undefinedVar,
                                        argument);
                }
                END_SAFE_REENTRANT_CALL
            }
            catch (const JavascriptException& err)
            {
                exception = err.GetAndClear();
            }
        }

        if (exception != nullptr)
        {
            return TryRejectWithExceptionObject(exception, promiseCapability->GetReject(), scriptContext);
        }

        Assert(handlerResult != nullptr);

        return TryCallResolveOrRejectHandler(promiseCapability->GetResolve(), handlerResult, scriptContext);
    }